

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::bean_ptr<B>::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (bean_ptr<B> *this,AVisitor<hiberlite::UpdateBean> *ar)

{
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar1;
  sqlid_t sVar2;
  logic_error *this_00;
  shared_res<hiberlite::autoclosed_con> local_f8;
  bean_key local_e8;
  shared_res<hiberlite::autoclosed_con> local_d0;
  bean_key local_c0;
  string local_a8;
  string local_88;
  sql_nvp<long_long> local_68;
  
  sVar2 = get_id(this);
  this->tmp_id = sVar2;
  if (sVar2 != -1) {
    local_f8._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    psVar1 = (ar->rootKey).con.res;
    if (psVar1 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      psVar1->refCount = psVar1->refCount + 1;
    }
    local_f8.res = psVar1;
    bean_key::bean_key(&local_e8,&((this->super_shared_res<hiberlite::real_bean<B>_>).res)->res->key
                      );
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_e8.con);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_f8);
    if ((psVar1 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) !=
        (local_e8.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0)) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"saving the bean from different database");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  std::__cxx11::string::string((string *)&local_88,"id",(allocator *)&local_e8);
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_f8);
  sql_nvp<long_long>::sql_nvp(&local_68,&local_88,&this->tmp_id,&local_a8);
  AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_68);
  sql_nvp<long_long>::~sql_nvp(&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  if (ar->purpose == 1) {
    local_d0._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    local_d0.res = (ar->rootKey).con.res;
    if (local_d0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_d0.res)->refCount = (local_d0.res)->refCount + 1;
    }
    local_c0.id = this->tmp_id;
    local_c0.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    if (local_d0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_d0.res)->refCount = (local_d0.res)->refCount + 1;
    }
    local_c0.con.res = local_d0.res;
    Registry<B>::get((bean_ptr<B> *)&local_e8,&local_c0);
    shared_res<hiberlite::real_bean<B>_>::operator=
              (&this->super_shared_res<hiberlite::real_bean<B>_>,
               (shared_res<hiberlite::real_bean<B>_> *)&local_e8);
    shared_res<hiberlite::real_bean<B>_>::~shared_res
              ((shared_res<hiberlite::real_bean<B>_> *)&local_e8);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_c0.con);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_d0);
  }
  return;
}

Assistant:

void bean_ptr<C>::hibernate(Archive & ar)
{
	tmp_id=get_id();

	if(tmp_id!=Database::NULL_ID
			&& ar.getConnection()!=shared_res< real_bean<C> >::get_object()->get_key().con)
		throw std::logic_error("saving the bean from different database");

	ar & hiberlite::sql_nvp< sqlid_t > ("id", tmp_id );
	if(ar.is_loading())
		*this=Registry<C>::get( bean_key(ar.getConnection(), tmp_id) );
}